

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

Quat rw::lerp(Quat *q,Quat *p,float32 r)

{
  Quat QVar1;
  undefined1 local_40 [8];
  Quat q1;
  float32 c;
  float32 r_local;
  Quat *p_local;
  Quat *q_local;
  
  local_40._0_4_ = q->x;
  local_40._4_4_ = q->y;
  q1.x = q->z;
  q1.y = q->w;
  q1.w = r;
  q1.z = dot((Quat *)local_40,p);
  if ((float)q1.z < 0.0) {
    q1.z = (float32)-(float)q1.z;
    QVar1 = negate((Quat *)local_40);
    local_40 = QVar1._0_8_;
    q1._0_8_ = QVar1._8_8_;
  }
  QVar1 = makeQuat((float32)((float)q1.w * ((float)p->w - (float)q1.y) + (float)q1.y),
                   (float32)((float)q1.w * ((float)p->x - (float)local_40._0_4_) +
                            (float)local_40._0_4_),
                   (float32)((float)q1.w * ((float)p->y - (float)local_40._4_4_) +
                            (float)local_40._4_4_),
                   (float32)((float)q1.w * ((float)p->z - (float)q1.x) + (float)q1.x));
  return QVar1;
}

Assistant:

Quat
lerp(const Quat &q, const Quat &p, float32 r)
{
	float32 c;
	Quat q1 = q;
	c = dot(q1, p);
	if(c < 0.0f){
		c = -c;
		q1 = negate(q1);
	}
	return makeQuat(q1.w + r*(p.w - q1.w),
	                q1.x + r*(p.x - q1.x),
	                q1.y + r*(p.y - q1.y),
	                q1.z + r*(p.z - q1.z));
}